

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::TypedExpectation<TestResult_(mp::CallExpr)>::~TypedExpectation
          (TypedExpectation<TestResult_(mp::CallExpr)> *this)

{
  linked_ptr<testing::ActionInterface<TestResult_(mp::CallExpr)>_> *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_001e6218;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (linked_ptr<testing::ActionInterface<TestResult_(mp::CallExpr)>_> *)*ppvVar1;
    if (this_00 != (linked_ptr<testing::ActionInterface<TestResult_(mp::CallExpr)>_> *)0x0) {
      linked_ptr<testing::ActionInterface<TestResult_(mp::CallExpr)>_>::~linked_ptr(this_00);
      operator_delete(this_00,0x10);
    }
  }
  linked_ptr<testing::ActionInterface<TestResult_(mp::CallExpr)>_>::~linked_ptr
            (&(this->repeated_action_).impl_);
  (this->extra_matcher_).super_MatcherBase<const_std::tuple<mp::CallExpr>_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001e2b08;
  linked_ptr<const_testing::MatcherInterface<const_std::tuple<mp::CallExpr>_&>_>::~linked_ptr
            (&(this->extra_matcher_).super_MatcherBase<const_std::tuple<mp::CallExpr>_&>.impl_);
  (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<mp::CallExpr>_>.
  super__Head_base<0UL,_testing::Matcher<mp::CallExpr>,_false>._M_head_impl.
  super_MatcherBase<mp::CallExpr>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001e2ae8;
  linked_ptr<const_testing::MatcherInterface<mp::CallExpr>_>::~linked_ptr
            (&(this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<mp::CallExpr>_>.
              super__Head_base<0UL,_testing::Matcher<mp::CallExpr>,_false>._M_head_impl.
              super_MatcherBase<mp::CallExpr>.impl_);
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

virtual ~TypedExpectation() {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }